

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QLoggingRule>::emplace<QLoggingRule>
          (QMovableArrayOps<QLoggingRule> *this,qsizetype i,QLoggingRule *args)

{
  QLoggingRule **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  QLoggingRule tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size == i
       ) {
      qVar5 = QArrayDataPointer<QLoggingRule>::freeSpaceAtEnd
                        ((QArrayDataPointer<QLoggingRule> *)this);
      if (qVar5 == 0) goto LAB_00232063;
      QLoggingRule::QLoggingRule
                ((this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
                 ptr + (this->super_QGenericArrayOps<QLoggingRule>).
                       super_QArrayDataPointer<QLoggingRule>.size,args);
LAB_0023215c:
      pqVar2 = &(this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0023211b;
    }
LAB_00232063:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QLoggingRule>::freeSpaceAtBegin
                        ((QArrayDataPointer<QLoggingRule> *)this);
      if (qVar5 != 0) {
        QLoggingRule::QLoggingRule
                  ((this->super_QGenericArrayOps<QLoggingRule>).
                   super_QArrayDataPointer<QLoggingRule>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QLoggingRule>).
                   super_QArrayDataPointer<QLoggingRule>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0023215c;
      }
    }
  }
  tmp._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.category.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.category.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.category.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLoggingRule::QLoggingRule(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size !=
          0;
  QArrayDataPointer<QLoggingRule>::detachAndGrow
            ((QArrayDataPointer<QLoggingRule> *)this,(uint)(i == 0 && bVar6),1,(QLoggingRule **)0x0,
             (QArrayDataPointer<QLoggingRule> *)0x0);
  if (i == 0 && bVar6) {
    QLoggingRule::QLoggingRule
              ((this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
               ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
               ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QLoggingRule> *)this,i,1);
    QLoggingRule::QLoggingRule(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp);
LAB_0023211b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }